

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O3

thecl_t * th06_parse(FILE *in,char *filename,uint version)

{
  undefined8 *__ptr;
  int iVar1;
  list_node_t *plVar2;
  parser_state_t local_b8;
  
  local_b8.instr_time = 0;
  local_b8.instr_rank = 0xff;
  local_b8.instr_flags = 0;
  local_b8.uses_numbered_subs = true;
  local_b8.has_overdrive_difficulty = false;
  local_b8.has_numeric_difficulties = false;
  local_b8.uses_stack_offsets = false;
  local_b8.version = version;
  list_init(&local_b8.expressions);
  list_init(&local_b8.block_stack);
  list_init(&local_b8.global_definitions);
  local_b8.scope_stack = (int *)0x0;
  local_b8.scope_cnt = 0;
  local_b8.scope_id = 0;
  local_b8.current_sub = (thecl_sub_t *)0x0;
  local_b8.ecl = thecl_new();
  (local_b8.ecl)->version = version;
  local_b8.instr_format = th06_find_format;
  local_b8.instr_size = th06_instr_size;
  path_init(&local_b8.path_state,filename,argv0);
  thecl_yyin = in;
  iVar1 = thecl_yyparse(&local_b8);
  if (iVar1 == 0) {
    path_free(&local_b8.path_state);
    for (plVar2 = local_b8.global_definitions.head; plVar2 != (list_node_t *)0x0;
        plVar2 = plVar2->next) {
      __ptr = (undefined8 *)plVar2->data;
      free((void *)*__ptr);
      free(__ptr);
    }
    list_free_nodes(&local_b8.global_definitions);
    free(local_b8.scope_stack);
  }
  else {
    local_b8.ecl = (thecl_t *)0x0;
  }
  return local_b8.ecl;
}

Assistant:

static thecl_t*
th06_parse(
    FILE* in,
    char* filename,
    unsigned int version)
{
    parser_state_t state;

    state.instr_time = 0;
    state.instr_rank = 0xff;
    state.instr_flags = 0;
    state.version = version;
    state.uses_numbered_subs = true;
    state.has_overdrive_difficulty = false;
    state.uses_stack_offsets = false;
    state.has_numeric_difficulties = false;
    list_init(&state.expressions);
    list_init(&state.block_stack);
    list_init(&state.global_definitions);
    state.scope_stack = NULL;
    state.scope_cnt = 0;
    state.scope_id = 0;
    state.current_sub = NULL;
    state.ecl = thecl_new();
    state.ecl->version = version;
    state.instr_format = th06_find_format;
    state.instr_size = th06_instr_size;

    path_init(&state.path_state, filename, argv0);

    thecl_yyin = in;

    if (thecl_yyparse(&state) != 0)
        return 0;

    path_free(&state.path_state);

    global_definition_t* def;
    list_for_each(&state.global_definitions, def) {
        free(def->param);
        free(def);
    }
    list_free_nodes(&state.global_definitions);

    free(state.scope_stack);

    return state.ecl;
}